

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O2

bool __thiscall
miniros::RPCManager::validateXmlrpcResponse
          (RPCManager *this,string *method,XmlRpcValue *response,XmlRpcValue *payload)

{
  uint uVar1;
  int iVar2;
  XmlRpcValue *pXVar3;
  uint *puVar4;
  string *psVar5;
  Level level;
  void *logger_handle;
  char *fmt;
  string status_string;
  XmlRpcValue local_60;
  string empty_array;
  int offset;
  
  if (response->_type == TypeArray) {
    iVar2 = XmlRpc::XmlRpcValue::size(response);
    if ((iVar2 == 2) || (iVar2 = XmlRpc::XmlRpcValue::size(response), iVar2 == 3)) {
      pXVar3 = XmlRpc::XmlRpcValue::operator[](response,0);
      if (pXVar3->_type == TypeInt) {
        pXVar3 = XmlRpc::XmlRpcValue::operator[](response,0);
        puVar4 = (uint *)XmlRpc::XmlRpcValue::operator_cast_to_int_(pXVar3);
        uVar1 = *puVar4;
        pXVar3 = XmlRpc::XmlRpcValue::operator[](response,1);
        if (pXVar3->_type == TypeString) {
          pXVar3 = XmlRpc::XmlRpcValue::operator[](response,1);
          psVar5 = XmlRpc::XmlRpcValue::operator_cast_to_string_(pXVar3);
          std::__cxx11::string::string((string *)&status_string,(string *)psVar5);
          if (uVar1 == 1) {
            iVar2 = XmlRpc::XmlRpcValue::size(response);
            if (iVar2 < 3) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&empty_array,"<value><array><data></data></array></value>",
                         (allocator<char> *)&local_60);
              offset = 0;
              XmlRpc::XmlRpcValue::XmlRpcValue(&local_60,&empty_array,&offset);
              XmlRpc::XmlRpcValue::operator=(payload,&local_60);
              XmlRpc::XmlRpcValue::~XmlRpcValue(&local_60);
              std::__cxx11::string::~string((string *)&empty_array);
            }
            else {
              pXVar3 = XmlRpc::XmlRpcValue::operator[](response,2);
              XmlRpc::XmlRpcValue::operator=(payload,pXVar3);
            }
          }
          else {
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                ::loc.initialized_ == false) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&empty_array,"miniros.RPCManager",(allocator<char> *)&local_60);
              console::initializeLogLocation
                        (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                          ::loc,&empty_array,Debug);
              std::__cxx11::string::~string((string *)&empty_array);
            }
            if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                ::loc.level_ != Debug) {
              console::setLogLocationLevel
                        (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                          ::loc,Debug);
              console::checkLogLocationEnabled
                        (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                          ::loc);
            }
            if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                ::loc.logger_enabled_ == true) {
              console::print((FilterBase *)0x0,
                             validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                             ::loc.logger_,
                             validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                             ::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/rpc_manager.cpp"
                             ,0xf5,
                             "bool miniros::RPCManager::validateXmlrpcResponse(const std::string &, XmlRpcValue &, XmlRpcValue &)"
                             ,"XML-RPC call [%s] returned an error (%d): [%s]",
                             (method->_M_dataplus)._M_p,(ulong)uVar1,status_string._M_dataplus._M_p)
              ;
            }
          }
          std::__cxx11::string::~string((string *)&status_string);
          return uVar1 == 1;
        }
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
            ::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&status_string,"miniros.RPCManager",(allocator<char> *)&empty_array);
          console::initializeLogLocation
                    (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                      ::loc,&status_string,Debug);
          std::__cxx11::string::~string((string *)&status_string);
        }
        if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel
                    (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                      ::loc,Debug);
          console::checkLogLocationEnabled
                    (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                      ::loc);
        }
        if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
            ::loc.logger_enabled_ == true) {
          fmt = "XML-RPC call [%s] didn\'t return a string as the 2nd element";
          iVar2 = 0xee;
          logger_handle =
               validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
               ::loc.logger_;
          level = validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                  ::loc.level_;
LAB_002401ab:
          console::print((FilterBase *)0x0,logger_handle,level,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/rpc_manager.cpp"
                         ,iVar2,
                         "bool miniros::RPCManager::validateXmlrpcResponse(const std::string &, XmlRpcValue &, XmlRpcValue &)"
                         ,fmt,(method->_M_dataplus)._M_p);
          return false;
        }
      }
      else {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
            ::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&status_string,"miniros.RPCManager",(allocator<char> *)&empty_array);
          console::initializeLogLocation
                    (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                      ::loc,&status_string,Debug);
          std::__cxx11::string::~string((string *)&status_string);
        }
        if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel
                    (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                      ::loc,Debug);
          console::checkLogLocationEnabled
                    (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                      ::loc);
        }
        if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
            ::loc.logger_enabled_ == true) {
          fmt = "XML-RPC call [%s] didn\'t return a int as the 1st element";
          iVar2 = 0xe7;
          logger_handle =
               validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
               ::loc.logger_;
          level = validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                  ::loc.level_;
          goto LAB_002401ab;
        }
      }
    }
    else {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
          ::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&status_string,"miniros.RPCManager",(allocator<char> *)&empty_array);
        console::initializeLogLocation
                  (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                    ::loc,&status_string,Debug);
        std::__cxx11::string::~string((string *)&status_string);
      }
      if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
          ::loc.level_ != Debug) {
        console::setLogLocationLevel
                  (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                    ::loc,Debug);
        console::checkLogLocationEnabled
                  (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                    ::loc);
      }
      if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
          ::loc.logger_enabled_ == true) {
        fmt = "XML-RPC call [%s] didn\'t return a 2 or 3-element array";
        iVar2 = 0xe1;
        logger_handle =
             validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
             ::loc.logger_;
        level = validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                ::loc.level_;
        goto LAB_002401ab;
      }
    }
  }
  else {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (validateXmlrpcResponse::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&status_string,"miniros.RPCManager",(allocator<char> *)&empty_array);
      console::initializeLogLocation(&validateXmlrpcResponse::loc,&status_string,Debug);
      std::__cxx11::string::~string((string *)&status_string);
    }
    if (validateXmlrpcResponse::loc.level_ != Debug) {
      console::setLogLocationLevel(&validateXmlrpcResponse::loc,Debug);
      console::checkLogLocationEnabled(&validateXmlrpcResponse::loc);
    }
    if (validateXmlrpcResponse::loc.logger_enabled_ == true) {
      fmt = "XML-RPC call [%s] didn\'t return an array";
      iVar2 = 0xdb;
      logger_handle = validateXmlrpcResponse::loc.logger_;
      level = validateXmlrpcResponse::loc.level_;
      goto LAB_002401ab;
    }
  }
  return false;
}

Assistant:

bool RPCManager::validateXmlrpcResponse(const std::string& method, XmlRpcValue &response,
                                    XmlRpcValue &payload)
{
  if (response.getType() != XmlRpcValue::TypeArray)
  {
    MINIROS_DEBUG("XML-RPC call [%s] didn't return an array",
        method.c_str());
    return false;
  }
  if (response.size() != 2 && response.size() != 3)
  {
    MINIROS_DEBUG("XML-RPC call [%s] didn't return a 2 or 3-element array",
        method.c_str());
    return false;
  }
  if (response[0].getType() != XmlRpcValue::TypeInt)
  {
    MINIROS_DEBUG("XML-RPC call [%s] didn't return a int as the 1st element",
        method.c_str());
    return false;
  }
  int status_code = response[0];
  if (response[1].getType() != XmlRpcValue::TypeString)
  {
    MINIROS_DEBUG("XML-RPC call [%s] didn't return a string as the 2nd element",
        method.c_str());
    return false;
  }
  std::string status_string = response[1];
  if (status_code != 1)
  {
    MINIROS_DEBUG("XML-RPC call [%s] returned an error (%d): [%s]",
        method.c_str(), status_code, status_string.c_str());
    return false;
  }
  if (response.size() > 2)
  {
    payload = response[2];
  }
  else
  {
    std::string empty_array = "<value><array><data></data></array></value>";
    int offset = 0;
    payload = XmlRpcValue(empty_array, &offset);
  }
  return true;
}